

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Event *pEVar1;
  uint uVar2;
  int32_t iVar3;
  ImGuiIO *pIVar4;
  ImGuiStyle *pIVar5;
  _Base_ptr p_Var6;
  ImDrawData *drawData;
  long lVar7;
  _Map_pointer ppEVar8;
  Event *pEVar9;
  Event *event;
  Event *event_00;
  float fVar10;
  double dVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_1f9;
  ImGuiWS imguiWS;
  int height;
  float fStack_1ec;
  VSync vsync;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  State state;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  int width;
  Event *local_d0;
  Event *local_c0;
  _Map_pointer local_b8;
  Event *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string httpRoot;
  string local_50;
  
  printf("Usage: %s [port] [http-root]\n",*argv);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&httpRoot,"../examples",(allocator<char> *)&state);
  uVar2 = 5000;
  if (1 < argc) {
    uVar2 = atoi(argv[1]);
    if (argc != 2) {
      std::__cxx11::string::assign((char *)&httpRoot);
    }
  }
  ImGui::DebugCheckVersionAndDataLayout("1.88 WIP",0x37d0,0x418,8,0x10,0x14,2);
  ImGui::CreateContext((ImFontAtlas *)0x0);
  pIVar4 = ImGui::GetIO();
  pIVar4->MouseDrawCursor = true;
  ImGui::StyleColorsDark((ImGuiStyle *)0x0);
  pIVar5 = ImGui::GetStyle();
  pIVar5->AntiAliasedFill = false;
  pIVar5 = ImGui::GetStyle();
  pIVar5->AntiAliasedLines = false;
  pIVar5 = ImGui::GetStyle();
  pIVar5->WindowRounding = 0.0;
  pIVar5 = ImGui::GetStyle();
  pIVar5->ScrollbarRounding = 0.0;
  ImGuiWS::ImGuiWS(&imguiWS);
  std::operator+(&local_90,&httpRoot,"/demo-null");
  std::__cxx11::string::string<std::allocator<char>>((string *)&state,"",(allocator<char> *)&width);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state.clients._M_t._M_impl.super__Rb_tree_header,"index.html",
             (allocator<char> *)&height);
  __l._M_len = 2;
  __l._M_array = (iterator)&state;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b8,__l,(allocator_type *)&local_1a0);
  ImGuiWS::init(&imguiWS,(EVP_PKEY_CTX *)(ulong)uVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  lVar7 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&state.showDemoWindow + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  std::__cxx11::string::~string((string *)&local_90);
  pIVar4 = ImGui::GetIO();
  ImFontAtlas::GetTexDataAsAlpha8(pIVar4->Fonts,(uchar **)&state,&width,&height,(int *)0x0);
  ImGuiWS::setTexture(&imguiWS,0,Alpha8,width,height,
                      (char *)CONCAT71(state._1_7_,state.showDemoWindow));
  vsync.tStep_us = 0x411a;
  lVar7 = std::chrono::_V2::system_clock::now();
  vsync.tLast_us = lVar7 / 1000;
  vsync.tNext_us = vsync.tLast_us + vsync.tStep_us;
  State::State(&state);
  do {
    ImGuiWS::takeEvents((deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *)&width,&imguiWS);
    pEVar1 = local_b0;
    ppEVar8 = local_b8;
    pEVar9 = local_c0;
    event_00 = local_d0;
    while (event_00 != pEVar1) {
      State::handle(&state,event_00);
      event_00 = event_00 + 1;
      if (event_00 == pEVar9) {
        event_00 = ppEVar8[1];
        ppEVar8 = ppEVar8 + 1;
        pEVar9 = event_00 + 7;
      }
    }
    State::update(&state);
    pIVar4 = ImGui::GetIO();
    (pIVar4->DisplaySize).x = 1200.0;
    (pIVar4->DisplaySize).y = 800.0;
    fVar10 = VSync::delta_s(&vsync);
    pIVar4->DeltaTime = fVar10;
    ImGui::NewFrame();
    if (state.showDemoWindow == true) {
      ImGui::ShowDemoWindow(&state.showDemoWindow);
    }
    ImGui::Begin("Hello, world!",(bool *)0x0,0);
    ImGui::Checkbox("Demo Window",&state.showDemoWindow);
    pIVar4 = ImGui::GetIO();
    fVar10 = pIVar4->Framerate;
    pIVar4 = ImGui::GetIO();
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / fVar10),
                (double)pIVar4->Framerate);
    ImGui::End();
    height = 0x41200000;
    fStack_1ec = 10.0;
    local_1a0._M_dataplus._M_p = (pointer)0x0;
    ImGui::SetNextWindowPos((ImVec2 *)&height,1,(ImVec2 *)&local_1a0);
    height = 0x43c80000;
    fStack_1ec = 300.0;
    ImGui::SetNextWindowSize((ImVec2 *)&height,1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"WebSocket clients (",&local_1f9);
    std::__cxx11::to_string
              (&local_50,state.clients._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::operator+(&local_1a0,&local_100,&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&height,
                   &local_1a0,")");
    ImGui::Begin((char *)_height,(bool *)0x0,0x20);
    std::__cxx11::string::~string((string *)&height);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_100);
    ImGui::Text(" Id   Ip addr");
    for (p_Var6 = state.clients._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &state.clients._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      ImGui::Text("%3d : %s",(ulong)p_Var6[1]._M_color,p_Var6[1]._M_left);
      if (*(char *)&p_Var6[1]._M_parent == '\x01') {
        ImGui::SameLine(0.0,-1.0);
        fVar10 = state.tControlNext_s;
        dVar11 = ImGui::GetTime();
        ImGui::TextDisabled(" [has control for %4.2f seconds]",(double)fVar10 - dVar11);
      }
    }
    ImGui::End();
    ImGui::Render();
    drawData = ImGui::GetDrawData();
    ImGuiWS::setDrawData(&imguiWS,drawData);
    do {
      VSync::wait(&vsync,drawData);
      iVar3 = ImGuiWS::nConnected(&imguiWS);
    } while (iVar3 == 0);
    std::deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::~deque
              ((deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *)&width);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s [port] [http-root]\n", argv[0]);

    int port = 5000;
    std::string httpRoot = "../examples";

    if (argc > 1) port = atoi(argv[1]);
    if (argc > 2) httpRoot = argv[2];

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGui::GetIO().MouseDrawCursor = true;

    ImGui::StyleColorsDark();
    ImGui::GetStyle().AntiAliasedFill = false;
    ImGui::GetStyle().AntiAliasedLines = false;
    ImGui::GetStyle().WindowRounding = 0.0f;
    ImGui::GetStyle().ScrollbarRounding = 0.0f;

    // setup imgui-ws
    ImGuiWS imguiWS;
    imguiWS.init(port, httpRoot + "/demo-null", { "", "index.html" });

    // prepare font texture
    {
        unsigned char * pixels;
        int width, height;
        ImGui::GetIO().Fonts->GetTexDataAsAlpha8(&pixels, &width, &height);
        imguiWS.setTexture(0, ImGuiWS::Texture::Type::Alpha8, width, height, (const char *) pixels);
    }

    VSync vsync;
    State state;

    while (true) {
        // websocket event handling
        auto events = imguiWS.takeEvents();
        for (auto & event : events) {
            state.handle(std::move(event));
        }
        state.update();

        {
            auto & io = ImGui::GetIO();
            io.DisplaySize = ImVec2(1200, 800);
            io.DeltaTime = vsync.delta_s();
        }

        ImGui::NewFrame();

        // render stuff
        if (state.showDemoWindow) {
            ImGui::ShowDemoWindow(&state.showDemoWindow);
        }

        // debug window
        {
            ImGui::Begin("Hello, world!");
            ImGui::Checkbox("Demo Window", &state.showDemoWindow);
            ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
            ImGui::End();
        }

        // show connected clients
        ImGui::SetNextWindowPos({ 10, 10 } , ImGuiCond_Always);
        ImGui::SetNextWindowSize({ 400, 300 } , ImGuiCond_Always);
        ImGui::Begin((std::string("WebSocket clients (") + std::to_string(state.clients.size()) + ")").c_str(), nullptr, ImGuiWindowFlags_NoCollapse);
        ImGui::Text(" Id   Ip addr");
        for (auto & [ cid, client ] : state.clients) {
            ImGui::Text("%3d : %s", cid, client.ip.c_str());
            if (client.hasControl) {
                ImGui::SameLine();
                ImGui::TextDisabled(" [has control for %4.2f seconds]", state.tControlNext_s - ImGui::GetTime());
            }
        }
        ImGui::End();

        // generate ImDrawData
        ImGui::Render();

        // store ImDrawData for asynchronous dispatching to WS clients
        imguiWS.setDrawData(ImGui::GetDrawData());

        // if not clients are connected, just sleep to save CPU
        do {
            vsync.wait();
        } while (imguiWS.nConnected() == 0);
    }

    ImGui::DestroyContext();

    return 0;
}